

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__1,true>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_bccf3fd9 comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  end_00;
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  CliqueVar CVar4;
  CliqueVar CVar5;
  pointer pdVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var11;
  CliqueVar *pCVar12;
  CliqueVar *pCVar13;
  CliqueVar *pCVar14;
  ulong uVar15;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1031:28)>
  __cmp;
  uint uVar16;
  ulong uVar17;
  CliqueVar *pCVar18;
  CliqueVar *pCVar19;
  long lVar20;
  _DistanceType __len;
  ulong uVar21;
  CliqueVar *pCVar22;
  long lVar23;
  CliqueVar *pCVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  uchar offsets_l_storage [128];
  byte local_101 [128];
  byte local_81 [81];
  
  do {
    lVar23 = (long)end._M_current - (long)begin._M_current;
    uVar21 = lVar23 >> 2;
    if ((long)uVar21 < 0x18) {
      pCVar13 = begin._M_current + 1;
      if ((leftmost & 1U) == 0) {
        _Var11._M_current = begin._M_current;
        if (pCVar13 != end._M_current && begin._M_current != end._M_current) {
          do {
            CVar4 = _Var11._M_current[1];
            pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            dVar28 = (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1);
            if (pdVar6[(uint)*_Var11._M_current & 0x7fffffff] *
                (double)(int)(((uint)*_Var11._M_current >> 0x1e & 2) - 1) <
                pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28) {
              pCVar14 = pCVar13;
              do {
                pCVar22 = pCVar14 + -2;
                *pCVar14 = pCVar14[-1];
                pCVar14 = pCVar14 + -1;
                pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start;
              } while ((double)(((int)*pCVar22 >> 0x1f) * -2 + -1) *
                       pdVar6[(uint)*pCVar22 & 0x7fffffff] <
                       pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28);
              *pCVar14 = CVar4;
            }
            pCVar14 = pCVar13 + 1;
            _Var11._M_current = pCVar13;
            pCVar13 = pCVar14;
          } while (pCVar14 != end._M_current);
        }
      }
      else if (pCVar13 != end._M_current && begin._M_current != end._M_current) {
        lVar23 = 4;
        _Var11._M_current = begin._M_current;
        do {
          CVar4 = _Var11._M_current[1];
          pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar28 = (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1);
          if (pdVar6[(uint)*_Var11._M_current & 0x7fffffff] *
              (double)(int)(((uint)*_Var11._M_current >> 0x1e & 2) - 1) <
              pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28) {
            lVar20 = lVar23;
            do {
              lVar26 = lVar20;
              *(undefined4 *)(&(begin._M_current)->field_0x0 + lVar26) =
                   *(undefined4 *)(&begin._M_current[-1].field_0x0 + lVar26);
              _Var11._M_current = begin._M_current;
              if (lVar26 == 4) goto LAB_0026c335;
              pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              lVar20 = lVar26 + -4;
            } while ((double)(((int)*(uint *)(&begin._M_current[-2].field_0x0 + lVar26) >> 0x1f) *
                              -2 + -1) *
                     pdVar6[*(uint *)(&begin._M_current[-2].field_0x0 + lVar26) & 0x7fffffff] <
                     pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28);
            _Var11._M_current = (CliqueVar *)(&begin._M_current[-1].field_0x0 + lVar26);
LAB_0026c335:
            *_Var11._M_current = CVar4;
          }
          pCVar14 = pCVar13 + 1;
          lVar23 = lVar23 + 4;
          _Var11._M_current = pCVar13;
          pCVar13 = pCVar14;
        } while (pCVar14 != end._M_current);
      }
LAB_0026c885:
      bVar27 = true;
    }
    else {
      uVar8 = uVar21 >> 1;
      pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)uVar21 < 0x81) {
        CVar4 = *begin._M_current;
        CVar5 = begin._M_current[uVar8];
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[uVar8] = CVar4;
          *begin._M_current = CVar5;
        }
        CVar4 = end._M_current[-1];
        CVar5 = *begin._M_current;
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          *begin._M_current = CVar4;
          end._M_current[-1] = CVar5;
        }
        CVar4 = *begin._M_current;
        CVar5 = begin._M_current[uVar8];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[uVar8] = CVar4;
          *begin._M_current = CVar5;
        }
      }
      else {
        CVar4 = begin._M_current[uVar8];
        CVar5 = *begin._M_current;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          *begin._M_current = CVar4;
          begin._M_current[uVar8] = CVar5;
        }
        CVar4 = end._M_current[-1];
        CVar5 = begin._M_current[uVar8];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[uVar8] = CVar4;
          end._M_current[-1] = CVar5;
        }
        CVar4 = begin._M_current[uVar8];
        CVar5 = *begin._M_current;
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          *begin._M_current = CVar4;
          begin._M_current[uVar8] = CVar5;
        }
        CVar4 = begin._M_current[uVar8 - 1];
        CVar5 = begin._M_current[1];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[1] = CVar4;
          begin._M_current[uVar8 - 1] = CVar5;
        }
        CVar4 = end._M_current[-2];
        CVar5 = begin._M_current[uVar8 - 1];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[uVar8 - 1] = CVar4;
          end._M_current[-2] = CVar5;
        }
        CVar4 = begin._M_current[uVar8 - 1];
        CVar5 = begin._M_current[1];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[1] = CVar4;
          begin._M_current[uVar8 - 1] = CVar5;
        }
        CVar4 = begin._M_current[uVar8 + 1];
        CVar5 = begin._M_current[2];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[2] = CVar4;
          begin._M_current[uVar8 + 1] = CVar5;
        }
        CVar4 = end._M_current[-3];
        CVar5 = begin._M_current[uVar8 + 1];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[uVar8 + 1] = CVar4;
          end._M_current[-3] = CVar5;
        }
        CVar4 = begin._M_current[uVar8 + 1];
        CVar5 = begin._M_current[2];
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6[(ulong)(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1) <
            pdVar6[(ulong)(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1))
        {
          begin._M_current[2] = CVar4;
          begin._M_current[uVar8 + 1] = CVar5;
        }
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CVar4 = begin._M_current[uVar8 - 1];
        CVar5 = (begin._M_current + (uVar8 - 1))[1];
        if (pdVar6[(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1) <
            pdVar6[(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1)) {
          begin._M_current[uVar8 - 1] = CVar5;
          begin._M_current[uVar8] = CVar4;
        }
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CVar4 = begin._M_current[uVar8];
        CVar5 = (begin._M_current + uVar8)[1];
        if (pdVar6[(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1) <
            pdVar6[(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1)) {
          begin._M_current[uVar8] = CVar5;
          begin._M_current[uVar8 + 1] = CVar4;
        }
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CVar4 = begin._M_current[uVar8 - 1];
        CVar5 = (begin._M_current + (uVar8 - 1))[1];
        if (pdVar6[(uint)CVar4 & 0x7fffffff] * (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1) <
            pdVar6[(uint)CVar5 & 0x7fffffff] * (double)(int)(((uint)CVar5 >> 0x1e & 2) - 1)) {
          begin._M_current[uVar8 - 1] = CVar5;
          begin._M_current[uVar8] = CVar4;
        }
        CVar4 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar8];
        begin._M_current[uVar8] = CVar4;
      }
      if ((leftmost & 1U) == 0) {
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CVar4 = *begin._M_current;
        dVar29 = (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1);
        dVar28 = pdVar6[(uint)CVar4 & 0x7fffffff] * dVar29;
        if (dVar28 < pdVar6[(uint)begin._M_current[-1] & 0x7fffffff] *
                     (double)(int)(((uint)begin._M_current[-1] >> 0x1e & 2) - 1)) goto LAB_0026c9e9;
        lVar23 = 0;
        do {
          lVar20 = lVar23;
          lVar23 = lVar20 + -4;
        } while ((double)(((int)*(uint *)(&end._M_current[-1].field_0x0 + lVar20) >> 0x1f) * -2 + -1
                         ) * pdVar6[*(uint *)(&end._M_current[-1].field_0x0 + lVar20) & 0x7fffffff]
                 < dVar28);
        pCVar13 = (CliqueVar *)(&end._M_current[-1].field_0x0 + lVar20);
        _Var11._M_current = begin._M_current;
        if (lVar20 + -4 == -4) {
          do {
            if (pCVar13 <= _Var11._M_current) break;
            pCVar14 = _Var11._M_current + 1;
            _Var11._M_current = _Var11._M_current + 1;
          } while (dVar28 <= (double)(((int)*pCVar14 >> 0x1f) * -2 + -1) *
                             pdVar6[(uint)*pCVar14 & 0x7fffffff]);
        }
        else {
          do {
            pCVar14 = _Var11._M_current + 1;
            _Var11._M_current = _Var11._M_current + 1;
          } while (dVar28 <= (double)(((int)*pCVar14 >> 0x1f) * -2 + -1) *
                             pdVar6[(uint)*pCVar14 & 0x7fffffff]);
        }
        if (_Var11._M_current < pCVar13) {
          do {
            CVar5 = *_Var11._M_current;
            *_Var11._M_current = *pCVar13;
            *pCVar13 = CVar5;
            pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            dVar28 = pdVar6[(uint)CVar4 & 0x7fffffff] * dVar29;
            do {
              pCVar14 = pCVar13 + -1;
              pCVar13 = pCVar13 + -1;
            } while ((double)(((int)*pCVar14 >> 0x1f) * -2 + -1) *
                     pdVar6[(uint)*pCVar14 & 0x7fffffff] < dVar28);
            do {
              pCVar14 = _Var11._M_current + 1;
              _Var11._M_current = _Var11._M_current + 1;
            } while (dVar28 <= (double)(((int)*pCVar14 >> 0x1f) * -2 + -1) *
                               pdVar6[(uint)*pCVar14 & 0x7fffffff]);
          } while (_Var11._M_current < pCVar13);
        }
        *begin._M_current = *pCVar13;
        *pCVar13 = CVar4;
        bVar27 = false;
        begin._M_current = pCVar13 + 1;
      }
      else {
LAB_0026c9e9:
        CVar4 = *begin._M_current;
        pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar28 = (double)(((int)CVar4 >> 0x1f) * -2 + -1);
        uVar16 = (uint)CVar4 & 0x7fffffff;
        dVar29 = pdVar6[uVar16] * dVar28;
        lVar20 = 0;
        do {
          lVar26 = lVar20;
          CVar5 = *(CliqueVar *)(&begin._M_current[1].field_0x0 + lVar26);
          lVar20 = lVar26 + 4;
        } while (dVar29 < (double)(((int)CVar5 >> 0x1f) * -2 + -1) *
                          pdVar6[(uint)CVar5 & 0x7fffffff]);
        pCVar13 = (CliqueVar *)(&begin._M_current[1].field_0x0 + lVar26);
        _Var11._M_current = end._M_current;
        if (lVar26 + 4 == 4) {
          do {
            if (_Var11._M_current <= pCVar13) break;
            pCVar14 = _Var11._M_current + -1;
            _Var11._M_current = _Var11._M_current + -1;
          } while ((double)(((int)*pCVar14 >> 0x1f) * -2 + -1) * pdVar6[(uint)*pCVar14 & 0x7fffffff]
                   <= dVar29);
        }
        else {
          do {
            pCVar14 = _Var11._M_current + -1;
            _Var11._M_current = _Var11._M_current + -1;
          } while ((double)(((int)*pCVar14 >> 0x1f) * -2 + -1) * pdVar6[(uint)*pCVar14 & 0x7fffffff]
                   <= dVar29);
        }
        pCVar14 = pCVar13;
        if (pCVar13 < _Var11._M_current) {
          pCVar22 = (CliqueVar *)(&begin._M_current[1].field_0x0 + lVar26) + 1;
          *(CliqueVar *)(&begin._M_current[1].field_0x0 + lVar26) = *_Var11._M_current;
          *_Var11._M_current = CVar5;
          pCVar18 = _Var11._M_current;
          pCVar24 = _Var11._M_current;
          pCVar14 = pCVar22;
          if (pCVar22 < _Var11._M_current) {
            lVar26 = 0;
            lVar20 = 0;
            uVar15 = 0;
            uVar8 = 0;
            do {
              uVar9 = (long)pCVar18 - (long)pCVar14 >> 2;
              uVar10 = uVar9 >> (uVar15 == 0);
              if (uVar8 != 0) {
                uVar10 = 0;
              }
              uVar9 = uVar9 - uVar10;
              if (uVar15 != 0) {
                uVar9 = 0;
              }
              if (uVar10 < 0x40) {
                uVar17 = uVar8;
                if (uVar10 != 0) {
                  uVar8 = 0;
                  do {
                    local_81[uVar17 + 1] = (byte)uVar8;
                    pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar8 = uVar8 + 1;
                    uVar17 = uVar17 + ((double)(((int)*pCVar14 >> 0x1f) * -2 + -1) *
                                       pdVar6[(uint)*pCVar14 & 0x7fffffff] <=
                                      pdVar6[uVar16] * dVar28);
                    pCVar14 = pCVar14 + 1;
                  } while (uVar10 != uVar8);
                }
              }
              else {
                pCVar19 = pCVar14;
                uVar10 = 0xfffffffffffffff8;
                do {
                  pCVar12 = pCVar19;
                  uVar17 = uVar10 + 8;
                  local_81[uVar8 + 1] = (byte)uVar17;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = ((double)(((int)pCVar14[uVar10 + 8] >> 0x1f) * -2 + -1) *
                            pdVar6[(ulong)(uint)pCVar14[uVar10 + 8] & 0x7fffffff] <=
                           pdVar6[uVar16] * dVar28) + uVar8;
                  cVar7 = (char)uVar10;
                  local_81[lVar25 + 1] = cVar7 + 9;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)((double)(((int)pCVar14[uVar10 + 9] >> 0x1f) * -2 + -1) *
                                   pdVar6[(ulong)(uint)pCVar14[uVar10 + 9] & 0x7fffffff] <=
                                  pdVar6[uVar16] * dVar28) + lVar25;
                  local_81[lVar25 + 1] = cVar7 + 10;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)((double)(((int)pCVar14[uVar10 + 10] >> 0x1f) * -2 + -1) *
                                   pdVar6[(ulong)(uint)pCVar14[uVar10 + 10] & 0x7fffffff] <=
                                  pdVar6[uVar16] * dVar28) + lVar25;
                  local_81[lVar25 + 1] = cVar7 + 0xb;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)((double)(((int)pCVar14[uVar10 + 0xb] >> 0x1f) * -2 + -1) *
                                   pdVar6[(ulong)(uint)pCVar14[uVar10 + 0xb] & 0x7fffffff] <=
                                  pdVar6[uVar16] * dVar28) + lVar25;
                  local_81[lVar25 + 1] = cVar7 + 0xc;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)((double)(((int)pCVar14[uVar10 + 0xc] >> 0x1f) * -2 + -1) *
                                   pdVar6[(ulong)(uint)pCVar14[uVar10 + 0xc] & 0x7fffffff] <=
                                  pdVar6[uVar16] * dVar28) + lVar25;
                  local_81[lVar25 + 1] = cVar7 + 0xd;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)((double)(((int)pCVar14[uVar10 + 0xd] >> 0x1f) * -2 + -1) *
                                   pdVar6[(ulong)(uint)pCVar14[uVar10 + 0xd] & 0x7fffffff] <=
                                  pdVar6[uVar16] * dVar28) + lVar25;
                  local_81[lVar25 + 1] = cVar7 + 0xe;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)((double)(((int)pCVar14[uVar10 + 0xe] >> 0x1f) * -2 + -1) *
                                   pdVar6[(ulong)(uint)pCVar14[uVar10 + 0xe] & 0x7fffffff] <=
                                  pdVar6[uVar16] * dVar28) + lVar25;
                  local_81[lVar25 + 1] = cVar7 + 0xf;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar8 = (ulong)((double)(((int)pCVar14[uVar10 + 0xf] >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)pCVar14[uVar10 + 0xf] & 0x7fffffff] <=
                                 pdVar6[uVar16] * dVar28) + lVar25;
                  pCVar19 = pCVar14 + uVar10 + 0x10;
                  uVar10 = uVar17;
                } while (uVar17 < 0x38);
                pCVar14 = pCVar12 + 8;
                uVar17 = uVar8;
              }
              if (uVar9 < 0x40) {
                if (uVar9 != 0) {
                  uVar8 = 0;
                  do {
                    uVar8 = uVar8 + 1;
                    local_101[uVar15 + 1] = (byte)uVar8;
                    pCVar19 = pCVar18 + -1;
                    pCVar18 = pCVar18 + -1;
                    pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>)
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar15 = uVar15 + (pdVar6[uVar16] * dVar28 <
                                      (double)(((int)*pCVar19 >> 0x1f) * -2 + -1) *
                                      pdVar6[(uint)*pCVar19 & 0x7fffffff]);
                  } while (uVar9 != uVar8);
                }
              }
              else {
                uVar8 = 0xfffffffffffffff8;
                do {
                  cVar7 = (char)uVar8;
                  local_101[uVar15 + 1] = cVar7 + 9;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (pdVar6[uVar16] * dVar28 <
                           (double)(((int)pCVar18[-1] >> 0x1f) * -2 + -1) *
                           pdVar6[(ulong)(uint)pCVar18[-1] & 0x7fffffff]) + uVar15;
                  local_101[lVar25 + 1] = cVar7 + 10;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)(pdVar6[uVar16] * dVar28 <
                                  (double)(((int)pCVar18[-2] >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)pCVar18[-2] & 0x7fffffff]) + lVar25;
                  local_101[lVar25 + 1] = cVar7 + 0xb;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)(pdVar6[uVar16] * dVar28 <
                                  (double)(((int)pCVar18[-3] >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)pCVar18[-3] & 0x7fffffff]) + lVar25;
                  local_101[lVar25 + 1] = cVar7 + 0xc;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)(pdVar6[uVar16] * dVar28 <
                                  (double)(((int)pCVar18[-4] >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)pCVar18[-4] & 0x7fffffff]) + lVar25;
                  local_101[lVar25 + 1] = cVar7 + 0xd;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)(pdVar6[uVar16] * dVar28 <
                                  (double)(((int)pCVar18[-5] >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)pCVar18[-5] & 0x7fffffff]) + lVar25;
                  local_101[lVar25 + 1] = cVar7 + 0xe;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)(pdVar6[uVar16] * dVar28 <
                                  (double)(((int)pCVar18[-6] >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)pCVar18[-6] & 0x7fffffff]) + lVar25;
                  local_101[lVar25 + 1] = cVar7 + 0xf;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar25 = (ulong)(pdVar6[uVar16] * dVar28 <
                                  (double)(((int)pCVar18[-7] >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)pCVar18[-7] & 0x7fffffff]) + lVar25;
                  local_101[lVar25 + 1] = cVar7 + 0x10;
                  pCVar19 = pCVar18 + -8;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  pCVar18 = pCVar18 + -8;
                  uVar15 = (ulong)(pdVar6[uVar16] * dVar28 <
                                  (double)(((int)*pCVar19 >> 0x1f) * -2 + -1) *
                                  pdVar6[(ulong)(uint)*pCVar19 & 0x7fffffff]) + lVar25;
                  uVar8 = uVar8 + 8;
                } while (uVar8 < 0x38);
              }
              uVar10 = uVar17;
              if (uVar15 < uVar17) {
                uVar10 = uVar15;
              }
              pbVar1 = local_81 + lVar26 + 1;
              pbVar2 = local_101 + lVar20 + 1;
              if (uVar17 == uVar15) {
                if (uVar10 != 0) {
                  uVar8 = 0;
                  do {
                    bVar3 = pbVar2[uVar8];
                    CVar5 = pCVar22[pbVar1[uVar8]];
                    pCVar22[pbVar1[uVar8]] = pCVar24[-(ulong)bVar3];
                    pCVar24[-(ulong)bVar3] = CVar5;
                    uVar8 = uVar8 + 1;
                  } while (uVar10 != uVar8);
                }
              }
              else if (uVar10 != 0) {
                pCVar19 = pCVar24 + -(ulong)*pbVar2;
                CVar5 = pCVar22[*pbVar1];
                pCVar22[*pbVar1] = *pCVar19;
                if (uVar10 != 1) {
                  uVar8 = 1;
                  do {
                    bVar3 = pbVar1[uVar8];
                    *pCVar19 = pCVar22[bVar3];
                    pCVar19 = pCVar24 + -(ulong)pbVar2[uVar8];
                    pCVar22[bVar3] = *pCVar19;
                    uVar8 = uVar8 + 1;
                  } while (uVar10 != uVar8);
                }
                *pCVar19 = CVar5;
              }
              uVar8 = uVar17 - uVar10;
              lVar26 = lVar26 + uVar10;
              lVar20 = lVar20 + uVar10;
              if (uVar17 <= uVar15) {
                lVar26 = 0;
                pCVar22 = pCVar14;
              }
              uVar15 = uVar15 - uVar10;
              if (uVar15 == 0) {
                lVar20 = 0;
                pCVar24 = pCVar18;
              }
            } while (pCVar14 < pCVar18);
          }
          else {
            uVar8 = 0;
            uVar15 = 0;
            lVar20 = 0;
            lVar26 = 0;
          }
          for (; uVar8 != 0; uVar8 = uVar8 - 1) {
            pCVar14 = pCVar18 + -1;
            CVar5 = *(CliqueVar *)((long)pCVar22 + (ulong)local_81[uVar8 + lVar26] * 4);
            *(CliqueVar *)((long)pCVar22 + (ulong)local_81[uVar8 + lVar26] * 4) = pCVar18[-1];
            pCVar18[-1] = CVar5;
            pCVar18 = pCVar14;
          }
          for (; uVar15 != 0; uVar15 = uVar15 - 1) {
            pCVar22 = (CliqueVar *)
                      ((long)pCVar24 + (ulong)local_101[uVar15 + lVar20] * 0xfffffffffffffffc);
            CVar5 = *pCVar22;
            *pCVar22 = *pCVar14;
            *pCVar14 = CVar5;
            pCVar14 = pCVar14 + 1;
          }
        }
        end_00._M_current = pCVar14 + -1;
        *begin._M_current = pCVar14[-1];
        pCVar14[-1] = CVar4;
        uVar15 = (long)end_00._M_current - (long)begin._M_current >> 2;
        uVar8 = (long)end._M_current - (long)pCVar14 >> 2;
        if (((long)uVar15 < (long)(uVar21 >> 3)) || ((long)uVar8 < (long)(uVar21 >> 3))) {
          bad_allowed = bad_allowed + -1;
          if (bad_allowed == 0) {
            lVar20 = (long)((uVar21 - ((long)(uVar21 - 2) >> 0x3f)) + -2) >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__1>>
                        (begin,lVar20,uVar21,begin._M_current[lVar20],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1031:28)>
                          )comp.objective);
              bVar27 = lVar20 != 0;
              lVar20 = lVar20 + -1;
            } while (bVar27);
            bVar27 = true;
            pCVar13 = end._M_current + -1;
            while (4 < lVar23) {
              CVar4 = *pCVar13;
              *pCVar13 = *begin._M_current;
              lVar23 = lVar23 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__1>>
                        (begin,0,lVar23 >> 2,CVar4,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1031:28)>
                          )comp.objective);
              pCVar13 = pCVar13 + -1;
            }
            bad_allowed = 0;
            goto LAB_0026d83d;
          }
          if (0x17 < (long)uVar15) {
            CVar4 = *begin._M_current;
            uVar21 = uVar15 & 0xfffffffffffffffc;
            *begin._M_current = *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar21);
            *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar21) = CVar4;
            CVar4 = pCVar14[-2];
            pCVar14[-2] = *(CliqueVar *)((long)pCVar14 + (-4 - uVar21));
            *(CliqueVar *)((long)pCVar14 + (-4 - uVar21)) = CVar4;
            if (0x80 < (long)uVar15) {
              uVar15 = uVar15 >> 2;
              CVar4 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar15 + 1];
              begin._M_current[uVar15 + 1] = CVar4;
              CVar4 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar15 + 2];
              begin._M_current[uVar15 + 2] = CVar4;
              CVar4 = pCVar14[-3];
              pCVar14[-3] = pCVar14[~uVar15 - 1];
              pCVar14[~uVar15 - 1] = CVar4;
              CVar4 = pCVar14[-4];
              pCVar14[-4] = pCVar14[-uVar15 + -3];
              pCVar14[-uVar15 + -3] = CVar4;
            }
          }
          if (0x17 < (long)uVar8) {
            uVar21 = uVar8 & 0xfffffffffffffffc;
            CVar4 = *pCVar14;
            *pCVar14 = *(CliqueVar *)((long)&pCVar14->field_0x0 + uVar21);
            *(CliqueVar *)((long)&pCVar14->field_0x0 + uVar21) = CVar4;
            CVar4 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar21);
            *(end._M_current - uVar21) = CVar4;
            if (0x80 < (long)uVar8) {
              uVar8 = uVar8 >> 2;
              CVar4 = pCVar14[1];
              pCVar14[1] = pCVar14[uVar8 + 1];
              pCVar14[uVar8 + 1] = CVar4;
              CVar4 = pCVar14[2];
              pCVar14[2] = pCVar14[uVar8 + 2];
              pCVar14[uVar8 + 2] = CVar4;
              CVar4 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar8];
              end._M_current[~uVar8] = CVar4;
              CVar4 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar8];
              end._M_current[-2 - uVar8] = CVar4;
            }
          }
        }
        else if (_Var11._M_current <= pCVar13) {
          if (begin._M_current == end_00._M_current) {
LAB_0026d638:
            if (pCVar14 == end._M_current) goto LAB_0026c885;
            lVar23 = 4;
            uVar21 = 0;
            pCVar13 = pCVar14;
            do {
              pCVar22 = pCVar13 + 1;
              if (pCVar22 == end._M_current) goto LAB_0026c885;
              pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              CVar4 = pCVar13[1];
              dVar28 = (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1);
              if (pdVar6[(uint)*pCVar13 & 0x7fffffff] *
                  (double)(int)(((uint)*pCVar13 >> 0x1e & 2) - 1) <
                  pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28) {
                lVar20 = lVar23;
                do {
                  lVar26 = lVar20;
                  *(undefined4 *)((long)&pCVar14->field_0x0 + lVar26) =
                       *(undefined4 *)((long)&pCVar14[-1].field_0x0 + lVar26);
                  pCVar13 = pCVar14;
                  if (lVar26 == 4) goto LAB_0026d70c;
                  uVar16 = *(uint *)((long)&pCVar14[-2].field_0x0 + lVar26);
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar20 = lVar26 + -4;
                } while ((double)(((int)uVar16 >> 0x1f) * -2 + -1) * pdVar6[uVar16 & 0x7fffffff] <
                         pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28);
                pCVar13 = (CliqueVar *)((long)&pCVar14[-1].field_0x0 + lVar26);
LAB_0026d70c:
                *pCVar13 = CVar4;
                uVar21 = uVar21 + ((long)pCVar22 - (long)pCVar13 >> 2);
              }
              lVar23 = lVar23 + 4;
              pCVar13 = pCVar22;
            } while (uVar21 < 9);
          }
          else {
            lVar23 = 4;
            uVar21 = 0;
            _Var11._M_current = begin._M_current;
            do {
              pCVar13 = _Var11._M_current + 1;
              if (pCVar13 == end_00._M_current) goto LAB_0026d638;
              pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              CVar4 = _Var11._M_current[1];
              dVar28 = (double)(int)(((uint)CVar4 >> 0x1e & 2) - 1);
              if (pdVar6[(uint)*_Var11._M_current & 0x7fffffff] *
                  (double)(int)(((uint)*_Var11._M_current >> 0x1e & 2) - 1) <
                  pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28) {
                lVar20 = lVar23;
                do {
                  lVar26 = lVar20;
                  *(undefined4 *)(&(begin._M_current)->field_0x0 + lVar26) =
                       *(undefined4 *)(&begin._M_current[-1].field_0x0 + lVar26);
                  _Var11._M_current = begin._M_current;
                  if (lVar26 == 4) goto LAB_0026d42f;
                  pdVar6 = ((comp.objective)->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar20 = lVar26 + -4;
                } while ((double)(((int)*(uint *)(&begin._M_current[-2].field_0x0 + lVar26) >> 0x1f)
                                  * -2 + -1) *
                         pdVar6[*(uint *)(&begin._M_current[-2].field_0x0 + lVar26) & 0x7fffffff] <
                         pdVar6[(uint)CVar4 & 0x7fffffff] * dVar28);
                _Var11._M_current = (CliqueVar *)(&begin._M_current[-1].field_0x0 + lVar26);
LAB_0026d42f:
                *_Var11._M_current = CVar4;
                uVar21 = uVar21 + ((long)pCVar13 - (long)_Var11._M_current >> 2);
              }
              lVar23 = lVar23 + 4;
              _Var11._M_current = pCVar13;
            } while (uVar21 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__1,true>
                  (begin,end_00,comp,bad_allowed,(bool)(leftmost & 1));
        bVar27 = false;
        leftmost = false;
        begin._M_current = pCVar14;
      }
    }
LAB_0026d83d:
    if (bVar27) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }